

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  uint32 uVar1;
  bool bVar2;
  InstOp IVar3;
  Frag FVar4;
  ostream *poVar5;
  LogMessage local_1b8;
  uint32 local_34;
  uint32 local_30;
  uint32 local_2c;
  int out;
  uint32 local_24;
  int out1;
  uint32 local_1c;
  int id_local;
  int root_local;
  Compiler *this_local;
  
  out1 = id;
  local_1c = root;
  _id_local = this;
  IVar3 = Prog::Inst::opcode(this->inst_ + root);
  if (IVar3 == kInstByteRange) {
    bVar2 = ByteRangeEqual(this,local_1c,out1);
    if (bVar2) {
      local_24 = nullPatchList.p;
      Frag::Frag((Frag *)&this_local,local_1c,nullPatchList);
    }
    else {
      this_local = (Compiler *)NoMatch(this);
    }
  }
  else {
    while (IVar3 = Prog::Inst::opcode(this->inst_ + (int)local_1c), IVar3 == kInstAlt) {
      out = Prog::Inst::out1(this->inst_ + (int)local_1c);
      bVar2 = ByteRangeEqual(this,out,out1);
      uVar1 = local_1c;
      if (bVar2) {
        local_2c = (uint32)PatchList::Mk(local_1c << 1 | 1);
        Frag::Frag((Frag *)&this_local,uVar1,(PatchList)local_2c);
        return (Frag)this_local;
      }
      if ((this->reversed_ & 1U) == 0) {
        FVar4 = NoMatch(this);
        return FVar4;
      }
      local_30 = Prog::Inst::out(this->inst_ + (int)local_1c);
      IVar3 = Prog::Inst::opcode(this->inst_ + (int)local_30);
      if (IVar3 != kInstAlt) {
        bVar2 = ByteRangeEqual(this,local_30,out1);
        uVar1 = local_1c;
        if (!bVar2) {
          FVar4 = NoMatch(this);
          return FVar4;
        }
        local_34 = (uint32)PatchList::Mk(local_1c << 1);
        Frag::Frag((Frag *)&this_local,uVar1,(PatchList)local_34);
        return (Frag)this_local;
      }
      local_1c = local_30;
    }
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
               0x26f);
    poVar5 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar5,"should never happen");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    this_local = (Compiler *)NoMatch(this);
  }
  return (Frag)this_local;
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}